

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O2

void skynet_updatetime(void)

{
  uint32_t *puVar1;
  ulong uVar2;
  timer *ptVar3;
  uint uVar4;
  uint64_t uVar5;
  uint uVar6;
  uint idx;
  uint uVar7;
  int level;
  int iVar8;
  uint uVar9;
  
  uVar5 = gettime();
  ptVar3 = TI;
  uVar2 = TI->current_point;
  if (uVar5 < uVar2) {
    skynet_error((skynet_context *)0x0,"time diff error: change from %lld to %lld",uVar5);
    TI->current_point = uVar5;
  }
  else if (uVar5 != uVar2) {
    uVar7 = (int)uVar5 - (int)uVar2;
    TI->current_point = uVar5;
    puVar1 = &ptVar3->current;
    uVar9 = *puVar1;
    *puVar1 = *puVar1 + uVar7;
    if (CARRY4(uVar9,uVar7)) {
      puVar1 = &ptVar3->starttime;
      *puVar1 = *puVar1 + 0x28f5c28;
    }
    for (uVar9 = 0; ptVar3 = TI, uVar9 != uVar7; uVar9 = uVar9 + 1) {
      spinlock_lock(&TI->lock);
      timer_execute(ptVar3);
      uVar4 = ptVar3->time + 1;
      ptVar3->time = uVar4;
      if (uVar4 == 0) {
        level = 3;
        idx = 0;
LAB_001122da:
        move_list(ptVar3,level,idx);
      }
      else {
        uVar6 = uVar4 >> 8;
        level = 0;
        for (iVar8 = 0x100; (iVar8 - 1U & uVar4) == 0; iVar8 = iVar8 << 6) {
          idx = uVar6 & 0x3f;
          if (idx != 0) goto LAB_001122da;
          uVar6 = uVar6 >> 6;
          level = level + 1;
        }
      }
      timer_execute(ptVar3);
      (ptVar3->lock).lock = 0;
    }
  }
  return;
}

Assistant:

void
skynet_updatetime(void) {
	uint64_t cp = gettime();
	if(cp < TI->current_point) {
		skynet_error(NULL, "time diff error: change from %lld to %lld", cp, TI->current_point);
		TI->current_point = cp;
	} else if (cp != TI->current_point) {
		uint32_t diff = (uint32_t)(cp - TI->current_point);
		TI->current_point = cp;

		uint32_t oc = TI->current;
		TI->current += diff;
		if (TI->current < oc) {
			// when cs > 0xffffffff(about 497 days), time rewind
			TI->starttime += 0xffffffff / 100;
		}
		int i;
		for (i=0;i<diff;i++) {
			timer_update(TI);
		}
	}
}